

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_handle.cpp
# Opt level: O2

void __thiscall
libtorrent::session_handle::
async_call<void(libtorrent::aux::session_impl::*)(libtorrent::ip_filter_const&),libtorrent::ip_filter_const&>
          (session_handle *this,offset_in_session_impl_to_subr f,ip_filter *a)

{
  io_context *ctx;
  ip_filter *in_RCX;
  shared_ptr<libtorrent::aux::session_impl> s;
  __shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2> local_b8;
  undefined1 local_a8 [32];
  ip_filter local_88;
  
  ::std::__shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_b8,this);
  if (local_b8._M_ptr != (element_type *)0x0) {
    ctx = (local_b8._M_ptr)->m_io_context;
    ::std::__shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2> *)local_a8,
               &local_b8);
    local_a8._16_8_ = f;
    local_a8._24_8_ = a;
    ip_filter::ip_filter(&local_88,in_RCX);
    boost::asio::
    dispatch<boost::asio::io_context,libtorrent::session_handle::async_call<void(libtorrent::aux::session_impl::*)(libtorrent::ip_filter_const&),libtorrent::ip_filter_const&>(void(libtorrent::aux::session_impl::*)(libtorrent::ip_filter_const&),libtorrent::ip_filter_const&)const::_lambda()_1_>
              (ctx,(type_conflict15 *)local_a8,(type *)0x0);
    const::{lambda()#1}::~async_call((_lambda___1_ *)local_a8);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
    return;
  }
  local_a8._0_4_ = invalid_session_handle;
  aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
            ((error_code_enum *)local_a8);
}

Assistant:

void session_handle::async_call(Fun f, Args&&... a) const
	{
		std::shared_ptr<session_impl> s = m_impl.lock();
		if (!s) aux::throw_ex<system_error>(errors::invalid_session_handle);
		dispatch(s->get_context(), [=]() mutable
		{
#ifndef BOOST_NO_EXCEPTIONS
			try {
#endif
				(s.get()->*f)(std::forward<Args>(a)...);
#ifndef BOOST_NO_EXCEPTIONS
			} catch (system_error const& e) {
				s->alerts().emplace_alert<session_error_alert>(e.code(), e.what());
			} catch (std::exception const& e) {
				s->alerts().emplace_alert<session_error_alert>(error_code(), e.what());
			} catch (...) {
				s->alerts().emplace_alert<session_error_alert>(error_code(), "unknown error");
			}
#endif
		});
	}